

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O3

void * lj_mem_newgco(lua_State *L,MSize size)

{
  undefined4 *puVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(L->glref).ptr32;
  puVar1 = (undefined4 *)(**(code **)(uVar2 + 0x10))(*(undefined8 *)(uVar2 + 0x18),0,0,size);
  if (puVar1 != (undefined4 *)0x0) {
    *(int *)(uVar2 + 0x20) = *(int *)(uVar2 + 0x20) + size;
    *puVar1 = *(undefined4 *)(uVar2 + 0x30);
    *(int *)(uVar2 + 0x30) = (int)puVar1;
    *(byte *)(puVar1 + 1) = *(byte *)(uVar2 + 0x28) & 3;
    return puVar1;
  }
  lj_err_mem(L);
}

Assistant:

void * LJ_FASTCALL lj_mem_newgco(lua_State *L, MSize size)
{
  global_State *g = G(L);
  GCobj *o = (GCobj *)g->allocf(g->allocd, NULL, 0, size);
  if (o == NULL)
    lj_err_mem(L);
  lua_assert(checkptr32(o));
  g->gc.total += size;
  setgcrefr(o->gch.nextgc, g->gc.root);
  setgcref(g->gc.root, o);
  newwhite(g, o);
  return o;
}